

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

void vmsa_tcr_ttbr_el2_write(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,uint64_t value)

{
  uint64_t uVar1;
  CPUState *cpu;
  uint64_t value_local;
  ARMCPRegInfo_conflict *ri_local;
  CPUARMState_conflict *env_local;
  
  uVar1 = raw_read(env,ri);
  uVar1 = extract64(uVar1 ^ value,0x30,0x10);
  if (uVar1 != 0) {
    uVar1 = arm_hcr_el2_eff_aarch64(env);
    if ((uVar1 & 0x400000000) != 0) {
      cpu = env_cpu(env);
      tlb_flush_by_mmuidx_aarch64(cpu,0x62);
    }
  }
  raw_write(env,ri,value);
  return;
}

Assistant:

static void vmsa_tcr_ttbr_el2_write(CPUARMState *env, const ARMCPRegInfo *ri,
                                    uint64_t value)
{
    /*
     * If we are running with E2&0 regime, then an ASID is active.
     * Flush if that might be changing.  Note we're not checking
     * TCR_EL2.A1 to know if this is really the TTBRx_EL2 that
     * holds the active ASID, only checking the field that might.
     */
    if (extract64(raw_read(env, ri) ^ value, 48, 16) &&
        (arm_hcr_el2_eff(env) & HCR_E2H)) {
        tlb_flush_by_mmuidx(env_cpu(env),
                            ARMMMUIdxBit_E20_2 |
                            ARMMMUIdxBit_E20_2_PAN |
                            ARMMMUIdxBit_E20_0);
    }
    raw_write(env, ri, value);
}